

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,bool *value)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  uint64_t pos;
  char sc;
  string tok;
  char local_49;
  string local_48;
  
  paVar2 = &local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar2;
  pos = CurrLoc(this);
  bVar3 = ReadIdentifier(this,&local_48);
  if (bVar3) {
    iVar4 = ::std::__cxx11::string::compare((char *)&local_48);
    if (iVar4 == 0) {
      *value = true;
    }
    else {
      iVar4 = ::std::__cxx11::string::compare((char *)&local_48);
      if (iVar4 != 0) goto LAB_0040fbcd;
      *value = false;
    }
    bVar3 = false;
  }
  else {
LAB_0040fbcd:
    SeekTo(this,pos);
    bVar3 = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  if (!bVar3) {
    return true;
  }
  bVar3 = Char1(this,&local_49);
  if (bVar3) {
    piVar1 = &(this->_curr_cursor).col;
    *piVar1 = *piVar1 + 1;
    if (local_49 == '1') {
      *value = true;
    }
    else {
      if (local_49 != '0') {
        local_48._M_dataplus._M_p = (pointer)paVar2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"\'0\' or \'1\' expected.\n","");
        PushError(this,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != paVar2) {
          operator_delete(local_48._M_dataplus._M_p,
                          CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                                   local_48.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_0040fc76;
      }
      *value = false;
    }
    bVar3 = true;
  }
  else {
LAB_0040fc76:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool AsciiParser::ReadBasicType(bool *value) {
  // 'true', 'false', '0' or '1'
  {
    std::string tok;

    auto loc = CurrLoc();
    bool ok = ReadIdentifier(&tok);

    if (ok) {
      if (tok == "true") {
        (*value) = true;
        return true;
      } else if (tok == "false") {
        (*value) = false;
        return true;
      }
    }

    // revert
    SeekTo(loc);
  }

  char sc;
  if (!Char1(&sc)) {
    return false;
  }
  _curr_cursor.col++;

  // sign or [0-9]
  if (sc == '0') {
    (*value) = false;
    return true;
  } else if (sc == '1') {
    (*value) = true;
    return true;
  } else {
    PushError("'0' or '1' expected.\n");
    return false;
  }
}